

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_javame_generator.cc
# Opt level: O0

void __thiscall
t_javame_generator::generate_java_struct_equality
          (t_javame_generator *this,ostream *out,t_struct *tstruct)

{
  t_struct *ptVar1;
  bool bVar2;
  int iVar3;
  e_req eVar4;
  uint uVar5;
  ostream *poVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  reference pptVar7;
  t_type *ptVar8;
  string *psVar9;
  string local_530;
  string local_510;
  string local_4f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_490;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_470;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_450;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_430;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_410;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_390;
  string local_370;
  string local_350;
  string local_330;
  string local_310;
  string local_2f0;
  string local_2d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b0;
  string local_290;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_270;
  string local_250 [8];
  string unequal;
  string local_228 [8];
  string that_present;
  string local_200 [8];
  string this_present;
  string name;
  bool can_be_null;
  bool is_optional;
  t_type *t;
  t_field **local_1a8;
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_1a0
  ;
  const_iterator m_iter;
  vector<t_field_*,_std::allocator<t_field_*>_> *members;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_40;
  t_struct *local_20;
  t_struct *tstruct_local;
  ostream *out_local;
  t_javame_generator *this_local;
  
  local_20 = tstruct;
  tstruct_local = (t_struct *)out;
  out_local = (ostream *)this;
  t_generator::indent_abi_cxx11_(&local_40,(t_generator *)this);
  poVar6 = std::operator<<(out,(string *)&local_40);
  poVar6 = std::operator<<(poVar6,"public boolean equals(Object that) {");
  std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_40);
  t_generator::indent_up((t_generator *)this);
  ptVar1 = tstruct_local;
  t_generator::indent_abi_cxx11_(&local_70,(t_generator *)this);
  poVar6 = std::operator<<((ostream *)ptVar1,(string *)&local_70);
  poVar6 = std::operator<<(poVar6,"if (that == null)");
  poVar6 = std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_90,(t_generator *)this);
  poVar6 = std::operator<<(poVar6,(string *)&local_90);
  poVar6 = std::operator<<(poVar6,"  return false;");
  poVar6 = std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_b0,(t_generator *)this);
  poVar6 = std::operator<<(poVar6,(string *)&local_b0);
  poVar6 = std::operator<<(poVar6,"if (that instanceof ");
  iVar3 = (*(local_20->super_t_type).super_t_doc._vptr_t_doc[3])();
  poVar6 = std::operator<<(poVar6,(string *)CONCAT44(extraout_var,iVar3));
  poVar6 = std::operator<<(poVar6,")");
  poVar6 = std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_d0,(t_generator *)this);
  poVar6 = std::operator<<(poVar6,(string *)&local_d0);
  poVar6 = std::operator<<(poVar6,"  return this.equals((");
  iVar3 = (*(local_20->super_t_type).super_t_doc._vptr_t_doc[3])();
  poVar6 = std::operator<<(poVar6,(string *)CONCAT44(extraout_var_00,iVar3));
  poVar6 = std::operator<<(poVar6,")that);");
  poVar6 = std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_f0,(t_generator *)this);
  poVar6 = std::operator<<(poVar6,(string *)&local_f0);
  poVar6 = std::operator<<(poVar6,"return false;");
  std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_70);
  t_oop_generator::scope_down(&this->super_t_oop_generator,(ostream *)tstruct_local);
  std::operator<<((ostream *)tstruct_local,(string *)&::endl_abi_cxx11_);
  ptVar1 = tstruct_local;
  t_generator::indent_abi_cxx11_(&local_110,(t_generator *)this);
  poVar6 = std::operator<<((ostream *)ptVar1,(string *)&local_110);
  poVar6 = std::operator<<(poVar6,"public boolean equals(");
  iVar3 = (*(local_20->super_t_type).super_t_doc._vptr_t_doc[3])();
  poVar6 = std::operator<<(poVar6,(string *)CONCAT44(extraout_var_01,iVar3));
  poVar6 = std::operator<<(poVar6," that) {");
  std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_110);
  t_generator::indent_up((t_generator *)this);
  ptVar1 = tstruct_local;
  t_generator::indent_abi_cxx11_(&local_130,(t_generator *)this);
  poVar6 = std::operator<<((ostream *)ptVar1,(string *)&local_130);
  poVar6 = std::operator<<(poVar6,"if (that == null)");
  poVar6 = std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_150,(t_generator *)this);
  poVar6 = std::operator<<(poVar6,(string *)&local_150);
  poVar6 = std::operator<<(poVar6,"  return false;");
  poVar6 = std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_170,(t_generator *)this);
  poVar6 = std::operator<<(poVar6,(string *)&local_170);
  poVar6 = std::operator<<(poVar6,"if (this == that)");
  poVar6 = std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_((string *)&members,(t_generator *)this);
  poVar6 = std::operator<<(poVar6,(string *)&members);
  poVar6 = std::operator<<(poVar6,"  return true;");
  std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&members);
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::~string((string *)&local_150);
  std::__cxx11::string::~string((string *)&local_130);
  m_iter._M_current = (t_field **)t_struct::get_members(local_20);
  __gnu_cxx::
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
  __normal_iterator(&local_1a0);
  local_1a8 = (t_field **)
              std::vector<t_field_*,_std::allocator<t_field_*>_>::begin(m_iter._M_current);
  local_1a0._M_current = local_1a8;
  while( true ) {
    t = (t_type *)
        std::vector<t_field_*,_std::allocator<t_field_*>_>::end
                  ((vector<t_field_*,_std::allocator<t_field_*>_> *)m_iter._M_current);
    bVar2 = __gnu_cxx::operator!=
                      (&local_1a0,
                       (__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                        *)&t);
    if (!bVar2) break;
    std::operator<<((ostream *)tstruct_local,(string *)&::endl_abi_cxx11_);
    pptVar7 = __gnu_cxx::
              __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
              ::operator*(&local_1a0);
    ptVar8 = t_field::get_type(*pptVar7);
    ptVar8 = t_generator::get_true_type(ptVar8);
    pptVar7 = __gnu_cxx::
              __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
              ::operator*(&local_1a0);
    eVar4 = t_field::get_req(*pptVar7);
    bVar2 = type_can_be_null(this,ptVar8);
    pptVar7 = __gnu_cxx::
              __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
              ::operator*(&local_1a0);
    psVar9 = t_field::get_name_abi_cxx11_(*pptVar7);
    std::__cxx11::string::string((string *)(this_present.field_2._M_local_buf + 8),(string *)psVar9)
    ;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_200,"true",(allocator *)(that_present.field_2._M_local_buf + 0xf));
    std::allocator<char>::~allocator((allocator<char> *)(that_present.field_2._M_local_buf + 0xf));
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_228,"true",(allocator *)(unequal.field_2._M_local_buf + 0xf))
    ;
    std::allocator<char>::~allocator((allocator<char> *)(unequal.field_2._M_local_buf + 0xf));
    std::__cxx11::string::string(local_250);
    if ((eVar4 == T_OPTIONAL) || (bVar2)) {
      pptVar7 = __gnu_cxx::
                __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                ::operator*(&local_1a0);
      generate_isset_check_abi_cxx11_(&local_290,this,*pptVar7);
      std::operator+(&local_270," && this.",&local_290);
      std::__cxx11::string::operator+=(local_200,(string *)&local_270);
      std::__cxx11::string::~string((string *)&local_270);
      std::__cxx11::string::~string((string *)&local_290);
      pptVar7 = __gnu_cxx::
                __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                ::operator*(&local_1a0);
      generate_isset_check_abi_cxx11_(&local_2d0,this,*pptVar7);
      std::operator+(&local_2b0," && that.",&local_2d0);
      std::__cxx11::string::operator+=(local_228,(string *)&local_2b0);
      std::__cxx11::string::~string((string *)&local_2b0);
      std::__cxx11::string::~string((string *)&local_2d0);
    }
    ptVar1 = tstruct_local;
    t_generator::indent_abi_cxx11_(&local_2f0,(t_generator *)this);
    poVar6 = std::operator<<((ostream *)ptVar1,(string *)&local_2f0);
    poVar6 = std::operator<<(poVar6,"boolean this_present_");
    poVar6 = std::operator<<(poVar6,(string *)(this_present.field_2._M_local_buf + 8));
    poVar6 = std::operator<<(poVar6," = ");
    poVar6 = std::operator<<(poVar6,local_200);
    poVar6 = std::operator<<(poVar6,";");
    poVar6 = std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_310,(t_generator *)this);
    poVar6 = std::operator<<(poVar6,(string *)&local_310);
    poVar6 = std::operator<<(poVar6,"boolean that_present_");
    poVar6 = std::operator<<(poVar6,(string *)(this_present.field_2._M_local_buf + 8));
    poVar6 = std::operator<<(poVar6," = ");
    poVar6 = std::operator<<(poVar6,local_228);
    poVar6 = std::operator<<(poVar6,";");
    poVar6 = std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_330,(t_generator *)this);
    poVar6 = std::operator<<(poVar6,(string *)&local_330);
    poVar6 = std::operator<<(poVar6,"if (");
    poVar6 = std::operator<<(poVar6,"this_present_");
    poVar6 = std::operator<<(poVar6,(string *)(this_present.field_2._M_local_buf + 8));
    poVar6 = std::operator<<(poVar6," || that_present_");
    poVar6 = std::operator<<(poVar6,(string *)(this_present.field_2._M_local_buf + 8));
    poVar6 = std::operator<<(poVar6,") {");
    std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_330);
    std::__cxx11::string::~string((string *)&local_310);
    std::__cxx11::string::~string((string *)&local_2f0);
    t_generator::indent_up((t_generator *)this);
    ptVar1 = tstruct_local;
    t_generator::indent_abi_cxx11_(&local_350,(t_generator *)this);
    poVar6 = std::operator<<((ostream *)ptVar1,(string *)&local_350);
    poVar6 = std::operator<<(poVar6,"if (!(");
    poVar6 = std::operator<<(poVar6,"this_present_");
    poVar6 = std::operator<<(poVar6,(string *)(this_present.field_2._M_local_buf + 8));
    poVar6 = std::operator<<(poVar6," && that_present_");
    poVar6 = std::operator<<(poVar6,(string *)(this_present.field_2._M_local_buf + 8));
    poVar6 = std::operator<<(poVar6,"))");
    poVar6 = std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_370,(t_generator *)this);
    poVar6 = std::operator<<(poVar6,(string *)&local_370);
    poVar6 = std::operator<<(poVar6,"  return false;");
    std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_370);
    std::__cxx11::string::~string((string *)&local_350);
    uVar5 = (*(ptVar8->super_t_doc)._vptr_t_doc[7])();
    if ((uVar5 & 1) == 0) {
      if (bVar2) {
        std::operator+(&local_470,"!this.",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&this_present.field_2 + 8));
        std::operator+(&local_450,&local_470,".equals(that.");
        std::operator+(&local_430,&local_450,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&this_present.field_2 + 8));
        std::operator+(&local_410,&local_430,")");
        std::__cxx11::string::operator=(local_250,(string *)&local_410);
        std::__cxx11::string::~string((string *)&local_410);
        std::__cxx11::string::~string((string *)&local_430);
        std::__cxx11::string::~string((string *)&local_450);
        std::__cxx11::string::~string((string *)&local_470);
      }
      else {
        std::operator+(&local_4d0,"this.",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&this_present.field_2 + 8));
        std::operator+(&local_4b0,&local_4d0," != that.");
        std::operator+(&local_490,&local_4b0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&this_present.field_2 + 8));
        std::__cxx11::string::operator=(local_250,(string *)&local_490);
        std::__cxx11::string::~string((string *)&local_490);
        std::__cxx11::string::~string((string *)&local_4b0);
        std::__cxx11::string::~string((string *)&local_4d0);
      }
    }
    else {
      std::operator+(&local_3f0,"TBaseHelper.compareTo(this.",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&this_present.field_2 + 8));
      std::operator+(&local_3d0,&local_3f0,", that.");
      std::operator+(&local_3b0,&local_3d0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&this_present.field_2 + 8));
      std::operator+(&local_390,&local_3b0,") != 0");
      std::__cxx11::string::operator=(local_250,(string *)&local_390);
      std::__cxx11::string::~string((string *)&local_390);
      std::__cxx11::string::~string((string *)&local_3b0);
      std::__cxx11::string::~string((string *)&local_3d0);
      std::__cxx11::string::~string((string *)&local_3f0);
    }
    ptVar1 = tstruct_local;
    t_generator::indent_abi_cxx11_(&local_4f0,(t_generator *)this);
    poVar6 = std::operator<<((ostream *)ptVar1,(string *)&local_4f0);
    poVar6 = std::operator<<(poVar6,"if (");
    poVar6 = std::operator<<(poVar6,local_250);
    poVar6 = std::operator<<(poVar6,")");
    poVar6 = std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_510,(t_generator *)this);
    poVar6 = std::operator<<(poVar6,(string *)&local_510);
    poVar6 = std::operator<<(poVar6,"  return false;");
    std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_510);
    std::__cxx11::string::~string((string *)&local_4f0);
    t_oop_generator::scope_down(&this->super_t_oop_generator,(ostream *)tstruct_local);
    std::__cxx11::string::~string(local_250);
    std::__cxx11::string::~string(local_228);
    std::__cxx11::string::~string(local_200);
    std::__cxx11::string::~string((string *)(this_present.field_2._M_local_buf + 8));
    __gnu_cxx::
    __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
    operator++(&local_1a0);
  }
  std::operator<<((ostream *)tstruct_local,(string *)&::endl_abi_cxx11_);
  poVar6 = t_generator::indent((t_generator *)this,(ostream *)tstruct_local);
  poVar6 = std::operator<<(poVar6,"return true;");
  std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
  t_oop_generator::scope_down(&this->super_t_oop_generator,(ostream *)tstruct_local);
  std::operator<<((ostream *)tstruct_local,(string *)&::endl_abi_cxx11_);
  ptVar1 = tstruct_local;
  t_generator::indent_abi_cxx11_(&local_530,(t_generator *)this);
  poVar6 = std::operator<<((ostream *)ptVar1,(string *)&local_530);
  poVar6 = std::operator<<(poVar6,"public int hashCode() {");
  std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_530);
  t_generator::indent_up((t_generator *)this);
  poVar6 = t_generator::indent((t_generator *)this,(ostream *)tstruct_local);
  poVar6 = std::operator<<(poVar6,"return 0;");
  std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
  t_generator::indent_down((t_generator *)this);
  poVar6 = t_generator::indent((t_generator *)this,(ostream *)tstruct_local);
  poVar6 = std::operator<<(poVar6,"}");
  poVar6 = std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
  return;
}

Assistant:

void t_javame_generator::generate_java_struct_equality(ostream& out, t_struct* tstruct) {
  out << indent() << "public boolean equals(Object that) {" << endl;
  indent_up();
  out << indent() << "if (that == null)" << endl << indent() << "  return false;" << endl
      << indent() << "if (that instanceof " << tstruct->get_name() << ")" << endl << indent()
      << "  return this.equals((" << tstruct->get_name() << ")that);" << endl << indent()
      << "return false;" << endl;
  scope_down(out);
  out << endl;

  out << indent() << "public boolean equals(" << tstruct->get_name() << " that) {" << endl;
  indent_up();
  out << indent() << "if (that == null)" << endl << indent() << "  return false;" << endl
      << indent() << "if (this == that)" << endl << indent() << "  return true;"  << endl;

  const vector<t_field*>& members = tstruct->get_members();
  vector<t_field*>::const_iterator m_iter;
  for (m_iter = members.begin(); m_iter != members.end(); ++m_iter) {
    out << endl;

    t_type* t = get_true_type((*m_iter)->get_type());
    // Most existing Thrift code does not use isset or optional/required,
    // so we treat "default" fields as required.
    bool is_optional = (*m_iter)->get_req() == t_field::T_OPTIONAL;
    bool can_be_null = type_can_be_null(t);
    string name = (*m_iter)->get_name();

    string this_present = "true";
    string that_present = "true";
    string unequal;

    if (is_optional || can_be_null) {
      this_present += " && this." + generate_isset_check(*m_iter);
      that_present += " && that." + generate_isset_check(*m_iter);
    }

    out << indent() << "boolean this_present_" << name << " = " << this_present << ";" << endl
        << indent() << "boolean that_present_" << name << " = " << that_present << ";" << endl
        << indent() << "if ("
        << "this_present_" << name << " || that_present_" << name << ") {" << endl;
    indent_up();
    out << indent() << "if (!("
        << "this_present_" << name << " && that_present_" << name << "))" << endl << indent()
        << "  return false;" << endl;

    if (t->is_binary()) {
      unequal = "TBaseHelper.compareTo(this." + name + ", that." + name + ") != 0";
    } else if (can_be_null) {
      unequal = "!this." + name + ".equals(that." + name + ")";
    } else {
      unequal = "this." + name + " != that." + name;
    }

    out << indent() << "if (" << unequal << ")" << endl << indent() << "  return false;" << endl;

    scope_down(out);
  }
  out << endl;
  indent(out) << "return true;" << endl;
  scope_down(out);
  out << endl;

  out << indent() << "public int hashCode() {" << endl;
  indent_up();
  indent(out) << "return 0;" << endl;
  indent_down();
  indent(out) << "}" << endl << endl;
}